

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O0

void decode_string(uint8_t *dst,uint8_t *src)

{
  int local_24;
  int local_20;
  int k;
  int i;
  int j;
  uint8_t *src_local;
  uint8_t *dst_local;
  
  k = 0;
  for (local_20 = 0; src[local_20] != '\0'; local_20 = local_20 + 1) {
    for (local_24 = 0; bca[src[local_20]][local_24] != '\0'; local_24 = local_24 + 1) {
      dst[k] = bca[src[local_20]][local_24];
      k = k + 1;
    }
  }
  dst[k] = '\0';
  return;
}

Assistant:

void decode_string(uint8_t dst[], uint8_t src[]) {
    int j = 0;
    for (int i = 0; src[i]; i++) {
        for (int k = 0; bca[src[i]][k]; ++k) {
            dst[j++] = bca[src[i]][k];
        }
    }
    dst[j] = '\0'; //terminator
}